

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v9::detail::format_uint<1u,char,fmt::v9::appender,unsigned__int128>
                   (appender out,unsigned___int128 value,int num_digits,bool upper)

{
  type tVar1;
  char *buffer;
  int in_ECX;
  undefined1 in_stack_ffffffffffffff48 [16];
  
  tVar1 = to_unsigned<int>(in_ECX);
  buffer = to_pointer<char>((buffer_appender<char>)
                            out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                            ,(ulong)tVar1);
  if (buffer == (char *)0x0) {
    format_uint<1u,char,unsigned__int128>
              (&stack0xffffffffffffff48,(unsigned___int128)in_stack_ffffffffffffff48,num_digits,
               upper);
    out = copy_str_noinline<char,char*,fmt::v9::appender>
                    (&stack0xffffffffffffff48,&stack0xffffffffffffff48 + in_ECX,out);
  }
  else {
    format_uint<1u,char,unsigned__int128>
              (buffer,(unsigned___int128)in_stack_ffffffffffffff48,num_digits,upper);
  }
  return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}